

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  pointer pAVar1;
  const_iterator cVar2;
  reference pAVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  iterator tArgument;
  uint in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *__offin;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *in_stack_ffffffffffffffa0;
  int __fdout;
  _List_const_iterator<argparse::Argument> in_stack_ffffffffffffffa8;
  ArgumentParser *in_stack_ffffffffffffffc8;
  list_iterator in_stack_ffffffffffffffd0;
  iterator local_20 [4];
  
  pbVar4 = in_RDI + 10;
  std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
            ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff88);
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
       emplace<std::basic_string_view<char,std::char_traits<char>>[2]>
                 (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8._M_node,
                  (basic_string_view<char,_std::char_traits<char>_> (*) [2])pbVar4);
  __fdout = (int)in_stack_ffffffffffffffa8._M_node;
  pAVar1 = std::_List_iterator<argparse::Argument>::operator->
                     ((_List_iterator<argparse::Argument> *)0x187dba);
  if ((pAVar1->field_0xcc & 1) == 0) {
    pbVar4 = in_RDI + 8;
    cVar2 = std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                      ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    __offin = in_RDI + 10;
    std::_List_const_iterator<argparse::Argument>::_List_const_iterator
              ((_List_const_iterator<argparse::Argument> *)&stack0xffffffffffffffa8,local_20);
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)&pbVar4->_M_str,
               (int)cVar2._M_node,(__off64_t *)__offin,__fdout,in_R8,in_R9,in_stack_ffffffffffffff78
              );
  }
  index_argument(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  pAVar3 = std::_List_iterator<argparse::Argument>::operator*
                     ((_List_iterator<argparse::Argument> *)0x187e48);
  return pAVar3;
}

Assistant:

Argument &add_argument(Targs... Fargs) {
            using array_of_sv = std::string_view[sizeof...(Targs)];
            auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                        array_of_sv{Fargs...});

            if (!tArgument->mIsOptional)
                mPositionalArguments.splice(cend(mPositionalArguments),
                                            mOptionalArguments, tArgument);

            index_argument(tArgument);
            return *tArgument;
        }